

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>,_float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<float> *original_costs,
            double cost_constant)

{
  float *pfVar1;
  init_policy_type iVar2;
  context *ctx;
  context *ctx_00;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  rep rVar11;
  long lVar12;
  ulong uVar13;
  random_engine *rng;
  int iVar14;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  long lVar15;
  undefined1 auVar16 [16];
  float delta;
  float fVar18;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  double dVar19;
  undefined1 auVar23 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar24 [16];
  float theta;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  slv;
  bit_array_impl local_168;
  float local_154;
  double local_150;
  double local_148;
  default_cost_type<float> *local_140;
  double local_138;
  double local_130;
  double local_128;
  int local_11c;
  bit_array_impl local_118;
  cost_type local_108;
  double local_f8;
  long local_f0;
  compute_order local_e8;
  solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  local_b0;
  undefined1 auVar17 [64];
  undefined1 extraout_var [60];
  
  auVar21 = ZEXT1664(ZEXT816(0) << 0x40);
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar21;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar21;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar21._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar21._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar21._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar21._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar21._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_138 = cost_constant;
  bit_array_impl::bit_array_impl(&local_168,variables);
  ctx = this->m_ctx;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)&local_108,ctx,original_costs,this->m_rng,variables);
  local_148 = (ctx->parameters).kappa_step;
  local_150 = (ctx->parameters).kappa_max;
  local_128 = (ctx->parameters).alpha;
  dVar20 = (ctx->parameters).delta;
  theta = (float)(ctx->parameters).theta;
  if (0.0 <= dVar20) {
    delta = (float)dVar20;
  }
  else {
    ctx_00 = this->m_ctx;
    local_b0.super_debug_logger<false>.ofs._0_4_ = theta;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar16 = SUB6416(ZEXT464(0x7f7fffff),0);
    }
    else {
      auVar22 = ZEXT464(0x7f7fffff);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      uVar13 = 0;
      do {
        pfVar1 = (float *)((long)local_108.linear_elements._M_t.
                                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                 super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar13 * 4);
        uVar13 = uVar13 + 1;
        auVar16 = vandps_avx(ZEXT416((uint)*pfVar1),auVar24);
        uVar4 = vcmpps_avx512vl(ZEXT416((uint)*pfVar1),ZEXT816(0) << 0x40,4);
        uVar5 = vcmpps_avx512vl(auVar16,auVar22._0_16_,1);
        bVar6 = (byte)uVar4 & (byte)uVar5;
        auVar17._16_48_ = auVar21._16_48_;
        auVar17._0_16_ = auVar22._0_16_;
        auVar21._4_60_ = auVar17._4_60_;
        auVar21._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_ + (uint)!(bool)(bVar6 & 1) * auVar22._0_4_
        ;
        auVar16 = auVar21._0_16_;
        auVar22 = ZEXT1664(auVar16);
      } while ((uint)variables != uVar13);
    }
    local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = auVar16._0_4_;
    auVar16 = vfnmadd132ss_fma(auVar16,auVar16,ZEXT416((uint)theta));
    local_118.m_size = auVar16._0_4_;
    info<float,float,float>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",(float *)&local_118,
               (float *)&local_e8,(float *)&local_b0);
    delta = (float)local_118.m_size;
  }
  local_f0 = (long)(ctx->parameters).w;
  local_130 = (ctx->parameters).pushing_k_factor;
  local_f8 = (ctx->parameters).pushing_objective_amplifier;
  solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::solver_inequalities_01coeff
            (&local_b0,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_108,constraints);
  compute_order::compute_order(&local_e8,(ctx->parameters).order,variables);
  dVar20 = (this->m_ctx->parameters).init_policy_random;
  local_118.m_size = 0;
  local_118.m_block_size = 0;
  local_118.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar2 = (ctx->parameters).init_policy;
  local_11c = variables;
  if (iVar2 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_168,original_costs,variables,0);
  }
  else {
    if (iVar2 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_168;
      x_optimistic = &local_118;
    }
    else {
      if (iVar2 != optimistic_solve) goto LAB_0036cf06;
      rng = this->m_rng;
      x_pessimistic = &local_118;
      x_optimistic = &local_168;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0036cf06:
  local_140 = original_costs;
  if (local_168.m_size != 0) {
    iVar14 = 0;
    do {
      dVar19 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar19 < dVar20) {
        bit_array_impl::invert(&local_168,iVar14);
      }
      iVar14 = iVar14 + 1;
    } while (local_168.m_size != iVar14);
  }
  if (local_118.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_118.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar20 = (ctx->parameters).kappa_min;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar11;
  rVar11 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar11;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array>
            (&local_e8,&local_b0,(bit_array *)&local_168);
  if ((ctx->parameters).limit != 0) {
    local_154 = (float)local_148;
    iVar14 = 0x7fffffff;
    lVar15 = 0;
    local_148 = (double)CONCAT44(local_148._4_4_,(float)local_150);
    local_150 = (double)CONCAT44(local_150._4_4_,(float)local_128);
    local_128 = (double)CONCAT44(local_128._4_4_,(float)local_130);
    local_130 = (double)CONCAT44(local_130._4_4_,(float)local_f8);
    fVar18 = (float)dVar20;
    while( true ) {
      iVar8 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                        (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,fVar18,delta,theta)
      ;
      if (iVar8 == 0) {
        dVar20 = default_cost_type<float>::results(local_140,(bit_array *)&local_168,local_138);
        store_if_better(this,(bit_array *)&local_168,dVar20,lVar15);
        auVar21 = ZEXT464((uint)fVar18);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_0036d0e0;
        iVar14 = 0;
        iVar8 = 0;
        goto LAB_0036d1f0;
      }
      if (iVar8 < iVar14) {
        store_if_better(this,(bit_array *)&local_168,iVar8,lVar15);
        iVar14 = iVar8;
      }
      if (local_f0 < lVar15) {
        auVar23._0_4_ = powf((float)iVar8 / (float)local_b0.m,local_150._0_4_);
        auVar23._4_60_ = extraout_var;
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)fVar18),auVar23._0_16_,ZEXT416((uint)local_154));
        fVar18 = auVar16._0_4_;
      }
      if (local_148._0_4_ < fVar18) break;
      lVar12 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar12;
      dVar20 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar20) && (dVar20 < (double)(lVar12 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar15 = lVar15 + 1, lVar15 == (ctx->parameters).limit)) break;
    }
  }
  __return_storage_ptr__->status = limit_reached;
LAB_0036d0e0:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,local_11c);
  }
  if (local_e8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
  }
  solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
  ::~solver_inequalities_01coeff(&local_b0);
  if ((__uniq_ptr_impl<float,_std::default_delete<float[]>_>)
      local_108.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
    operator_delete__((void *)local_108.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_168.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_168.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
LAB_0036d1f0:
  do {
    iVar9 = compute_order::
            push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                      (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,
                       auVar21._0_4_ * local_128._0_4_,delta,theta,local_130._0_4_);
    if (iVar9 == 0) {
      dVar20 = default_cost_type<float>::results(local_140,(bit_array *)&local_168,local_138);
      store_if_better(this,(bit_array *)&local_168,dVar20,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar8));
    }
    lVar15 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar15;
    auVar21 = ZEXT464((uint)auVar21._0_4_);
    dVar20 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar20) && (dVar20 < (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar9 = 1;
      do {
        fVar18 = auVar21._0_4_;
        iVar10 = compute_order::
                 run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,float>
                           (&local_e8,&local_b0,(bit_array *)&local_168,this->m_rng,fVar18,delta,
                            theta);
        if (iVar10 == 0) {
          dVar20 = default_cost_type<float>::results(local_140,(bit_array *)&local_168,local_138);
          store_if_better(this,(bit_array *)&local_168,dVar20,
                          (long)((ctx->parameters).pushing_iteration_limit * iVar14 - iVar9));
          auVar21 = ZEXT464((uint)fVar18);
          break;
        }
        if ((double)(iVar9 + -1) <= (ctx->parameters).w) {
          auVar21 = ZEXT464((uint)fVar18);
        }
        else {
          auVar22._0_4_ = powf((float)iVar10 / (float)local_b0.m,local_150._0_4_);
          auVar22._4_60_ = extraout_var_00;
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)fVar18),auVar22._0_16_,ZEXT416((uint)local_154));
          auVar21 = ZEXT1664(auVar16);
        }
        fVar18 = auVar21._0_4_;
        if (local_148._0_4_ < fVar18) break;
        lVar15 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar15;
        dVar20 = (this->m_ctx->parameters).time_limit;
        if ((0.0 < dVar20) && (dVar20 < (double)(lVar15 - (this->m_begin).__d.__r) / 1000000000.0))
        {
          auVar21 = ZEXT464((uint)fVar18);
          break;
        }
        auVar21 = ZEXT464((uint)fVar18);
        bVar3 = iVar9 < (ctx->parameters).pushing_iteration_limit;
        iVar9 = iVar9 + 1;
      } while (bVar3);
    }
    iVar8 = iVar8 + 1;
    iVar14 = iVar14 + -1;
  } while (iVar8 < (ctx->parameters).pushes_limit);
  goto LAB_0036d0e0;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }